

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O1

int32 compare(heapelement_t *l1,heapelement_t *l2)

{
  int iVar1;
  
  iVar1 = strcmp(l2->basephone,l1->basephone);
  if (iVar1 == 0) {
    iVar1 = 0;
    if ((l2->leftcontext != (char *)0x0) && (l1->leftcontext != (char *)0x0)) {
      iVar1 = strcmp(l2->leftcontext,l1->leftcontext);
      if (iVar1 == 0) {
        iVar1 = strcmp(l2->rightcontext,l1->rightcontext);
        if (iVar1 == 0) {
          iVar1 = strcmp(l2->wordposition,l1->wordposition);
          return iVar1;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int32 compare(heapelement_t *l1, heapelement_t *l2)
{
    int32 diff;

    /* For increasing alphabetical order */
    if ((diff = strcmp(l2->basephone,l1->basephone)) == 0){
	if (l2->leftcontext != NULL && l1->leftcontext != NULL){

	    /* These are triphones */
            if ((diff = strcmp(l2->leftcontext,l1->leftcontext)) == 0){
                if ((diff = strcmp(l2->rightcontext,l1->rightcontext)) == 0){
                    diff = strcmp(l2->wordposition,l1->wordposition);
                }
            }
        }
    }
    return diff;
}